

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O2

certificate_chain __thiscall
boost::certify::certificate_chain::from_file(certificate_chain *this,path *chain_path)

{
  uint __line;
  int iVar1;
  _Head_base<0UL,_stack_st_X509_*,_false> _Var2;
  X509 *pXVar3;
  char *__assertion;
  unique_ptr<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
  file;
  
  file._M_t.
  super___uniq_ptr_impl<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
  ._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
  .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31),_true,_false>
        )BIO_new_file((chain_path->m_pathname)._M_dataplus._M_p,"rb");
  if ((tuple<bio_st_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
       )file._M_t.
        super___uniq_ptr_impl<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
        ._M_t.
        super__Tuple_impl<0UL,_bio_st_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
        .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_bio_st_*,_false>)0x0) {
    __assertion = "file != nullptr";
    __line = 0x28;
  }
  else {
    _Var2._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
    if (_Var2._M_head_impl == (stack_st_X509 *)0x0) {
      __assertion = "certs != nullptr";
      __line = 0x2a;
    }
    else {
      do {
        pXVar3 = PEM_read_bio_X509_AUX
                           ((BIO *)file._M_t.
                                   super___uniq_ptr_impl<bio_st,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_bio_st_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_djarek[P]certify_tests____tests_extras_include_boost_certify_verification_utils_hpp:37:31)>
                                   .super__Head_base<0UL,_bio_st_*,_false>._M_head_impl,(X509 **)0x0
                            ,(undefined1 *)0x0,(void *)0x0);
        if (pXVar3 == (X509 *)0x0) {
          ERR_clear_error();
          iVar1 = OPENSSL_sk_num(_Var2._M_head_impl);
          if (0 < iVar1) {
            (this->handle_)._M_t.
            super___uniq_ptr_impl<stack_st_X509,_boost::certify::certificate_chain::chain_free>._M_t
            .super__Tuple_impl<0UL,_stack_st_X509_*,_boost::certify::certificate_chain::chain_free>.
            super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl = _Var2._M_head_impl;
            std::
            unique_ptr<bio_st,_const_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp:37:31)>
            ::~unique_ptr(&file);
            return (unique_ptr<stack_st_X509,_boost::certify::certificate_chain::chain_free>)
                   (unique_ptr<stack_st_X509,_boost::certify::certificate_chain::chain_free>)this;
          }
          __assertion = "sk_X509_num(certs) > 0";
          __line = 0x37;
          goto LAB_00103b06;
        }
        iVar1 = OPENSSL_sk_push(_Var2._M_head_impl);
      } while (iVar1 != 0);
      __assertion = "ret != 0";
      __line = 0x35;
    }
  }
LAB_00103b06:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]certify/tests/../tests/extras/include/boost/certify/verification_utils.hpp"
                ,__line,
                "static certificate_chain boost::certify::certificate_chain::from_file(const boost::filesystem::path &)"
               );
}

Assistant:

static certificate_chain from_file(
      boost::filesystem::path const& chain_path)
    {
        auto const bio_free = [](::BIO* b) { ::BIO_free(b); };
        std::unique_ptr<::BIO, decltype(bio_free)> file{
          ::BIO_new_file(chain_path.string().c_str(), "rb"), bio_free};
        assert(file != nullptr);
        auto* certs = sk_X509_new_null();
        assert(certs != nullptr);
        while (1)
        {
            auto* cert =
              ::PEM_read_bio_X509_AUX(file.get(), nullptr, nullptr, nullptr);
            if (!cert)
            {
                ::ERR_clear_error();
                break;
            }
            auto ret = sk_X509_push(certs, cert);
            assert(ret != 0);
        }
        assert(sk_X509_num(certs) > 0);

        return certificate_chain{certs};
    }